

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

size_t zt_cstr_len(char *s,ssize_t i,ssize_t j)

{
  size_t i_00;
  ssize_t sVar1;
  size_t sVar2;
  char *in_RDI;
  ssize_t t;
  size_t len;
  size_t in_stack_ffffffffffffffd8;
  undefined8 local_18;
  undefined8 local_10;
  
  i_00 = strlen(in_RDI);
  if (i_00 == 0) {
    local_10 = 0;
    local_18 = 0;
  }
  else {
    local_10 = IDX(i_00,in_stack_ffffffffffffffd8);
    sVar1 = IDX(i_00,in_stack_ffffffffffffffd8);
    local_18 = sVar1;
    if (sVar1 < local_10) {
      local_18 = local_10;
      local_10 = sVar1;
    }
  }
  sVar2 = IDXLEN(local_10,local_18);
  return sVar2;
}

Assistant:

size_t
zt_cstr_len(const char *s, ssize_t i, ssize_t j) {
    CONVERT(s, i, j);
    return IDXLEN(i, j);
}